

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffgsdt(int *day,int *month,int *year,int *status)

{
  tm *ptVar1;
  time_t now;
  time_t local_28;
  
  local_28 = time((time_t *)0x0);
  ptVar1 = gmtime(&local_28);
  if (ptVar1 == (tm *)0x0) {
    ptVar1 = localtime(&local_28);
  }
  *day = ptVar1->tm_mday;
  *month = ptVar1->tm_mon + 1;
  *year = ptVar1->tm_year + 0x76c;
  return *status;
}

Assistant:

int ffgsdt( int *day, int *month, int *year, int *status )
{  
/*
      This routine is included for backward compatibility
            with the Fortran FITSIO library.

   ffgsdt : Get current System DaTe (GMT if available)

      Return integer values of the day, month, and year

         Function parameters:
            day      Day of the month
            month    Numerical month (1=Jan, etc.)
            year     Year (1999, 2000, etc.)
            status   output error status

*/
   time_t now;
   struct tm *date;

   now = time( NULL );
   date = gmtime(&now);         /* get GMT (= UTC) time */

   if (!date)                  /* GMT not available on this machine */
   {
       date = localtime(&now); 
   }

   *day = date->tm_mday;
   *month = date->tm_mon + 1;
   *year = date->tm_year + 1900;  /* tm_year is defined as years since 1900 */
   return( *status );
}